

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O2

int sprkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int iVar1;
  long in_R8;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem local_20;
  
  local_20 = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessStepMem(ark_mem,"sprkStep_PrintAllStats",&local_20);
  if (iVar1 == 0) {
    sunfprintf_long(outfile,fmt,0x17a089,(char *)local_20->nf1,in_R8);
    sunfprintf_long(outfile,fmt,0x17a099,(char *)local_20->nf2,in_R8);
  }
  return iVar1;
}

Assistant:

int sprkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  sunfprintf_long(outfile, fmt, SUNFALSE, "f1 RHS fn evals", step_mem->nf1);
  sunfprintf_long(outfile, fmt, SUNFALSE, "f2 RHS fn evals", step_mem->nf2);

  return (ARK_SUCCESS);
}